

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom_test.cc
# Opt level: O0

Event * anon_unknown.dwarf_5a25::Event::Open(Event *__return_storage_ptr__,string *filename)

{
  string *filename_local;
  Event *e;
  
  Event(__return_storage_ptr__,kOpen);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->filename,(string *)filename);
  return __return_storage_ptr__;
}

Assistant:

static Event Open(const std::string &filename) {
    Event e(Syscall::kOpen);
    e.filename = filename;
    return e;
  }